

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_model_based_conversion.cc
# Opt level: O0

bool __thiscall
sptk::GaussianMixtureModelBasedConversion::Run
          (GaussianMixtureModelBasedConversion *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *source_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *target_vectors)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  difference_type dVar6;
  double *pdVar7;
  reference this_00;
  reference pvVar8;
  long in_RDX;
  vector<double,_std::allocator<double>_> *this_01;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  long in_RDI;
  int m;
  double tmp;
  int l;
  int selected_mixture;
  int t;
  Buffer buffer;
  vector<double,_std::allocator<double>_> components_of_log_probability;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> d;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  e;
  int sequence_length;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_000003b0;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_stack_000003b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_000003c0;
  NonrecursiveMaximumLikelihoodParameterGeneration *in_stack_000003c8;
  Buffer *in_stack_fffffffffffffdb0;
  allocator_type *in_stack_fffffffffffffdb8;
  SymmetricMatrix *matrix;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdc8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  undefined8 in_stack_fffffffffffffde8;
  double dVar9;
  SymmetricMatrix *in_stack_fffffffffffffdf0;
  int local_18c;
  double local_188;
  int local_17c;
  int local_14c;
  double local_148 [12];
  SymmetricMatrix local_e8;
  pointer in_stack_ffffffffffffff78;
  pointer in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffffa0;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  Buffer *in_stack_ffffffffffffffc0;
  byte local_1;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  if ((((*(byte *)(in_RDI + 0x88) & 1) == 0) ||
      (bVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::empty((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)in_stack_fffffffffffffdc0._M_current), bVar1)) || (in_RDX == 0)) {
    local_1 = 0;
  }
  else {
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(in_RSI);
    std::allocator<double>::allocator((allocator<double> *)0x10c79e);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0._M_current,
               (allocator_type *)in_stack_fffffffffffffdb8);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10c7da);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8,(value_type *)in_stack_fffffffffffffdc0._M_current,
             (allocator_type *)in_stack_fffffffffffffdb8);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10c80e);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x10c828);
    SymmetricMatrix::SymmetricMatrix(in_stack_fffffffffffffdf0,iVar2);
    std::allocator<sptk::SymmetricMatrix>::allocator((allocator<sptk::SymmetricMatrix> *)0x10c867);
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
              ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8,(value_type *)in_stack_fffffffffffffdc0._M_current,
               in_stack_fffffffffffffdb8);
    std::allocator<sptk::SymmetricMatrix>::~allocator((allocator<sptk::SymmetricMatrix> *)0x10c89b);
    SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffdb0);
    std::allocator<double>::allocator((allocator<double> *)0x10c8ce);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8,(allocator_type *)in_stack_fffffffffffffdc0._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x10c8f7);
    GaussianMixtureModeling::Buffer::Buffer(in_stack_fffffffffffffdb0);
    for (local_14c = 0; local_14c < (int)sVar3; local_14c = local_14c + 1) {
      if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
LAB_0010ca67:
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](in_RSI,(long)local_14c);
        this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x90);
        in_stack_fffffffffffffdb0 = (Buffer *)(in_RDI + 0xa8);
        __first._M_current = local_148;
        matrix = &local_e8;
        in_stack_fffffffffffffdc0._M_current = (double *)0x0;
        bVar1 = GaussianMixtureModeling::CalculateLogProbability
                          (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                           (bool)in_stack_ffffffffffffff8b,(bool)in_stack_ffffffffffffff8a,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffc0);
        if (!bVar1) {
          local_1 = 0;
          bVar1 = true;
          goto LAB_0010cdbc;
        }
        std::vector<double,_std::allocator<double>_>::begin(this_01);
        std::vector<double,_std::allocator<double>_>::end(this_01);
        std::
        max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (__first,in_stack_fffffffffffffdc0);
        std::vector<double,_std::allocator<double>_>::begin(this_01);
        dVar6 = __gnu_cxx::operator-
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)in_stack_fffffffffffffdb0,
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)this_01);
        iVar2 = (int)dVar6;
        for (local_17c = 0; local_17c < *(int *)(in_RDI + 0x14); local_17c = local_17c + 1) {
          local_188 = 0.0;
          for (local_18c = 0; local_18c < *(int *)(in_RDI + 0x10); local_18c = local_18c + 1) {
            std::vector<sptk::Matrix,_std::allocator<sptk::Matrix>_>::operator[]
                      ((vector<sptk::Matrix,_std::allocator<sptk::Matrix>_> *)(in_RDI + 0xc0),
                       (long)iVar2);
            pdVar7 = Matrix::operator[]((Matrix *)in_stack_fffffffffffffdb0,
                                        (int)((ulong)this_01 >> 0x20));
            dVar9 = pdVar7[local_18c];
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_RSI,(long)local_14c);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar4,(long)local_18c);
            local_188 = dVar9 * *pvVar5 + local_188;
          }
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0xd8),(long)iVar2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_17c);
          dVar9 = *pvVar5;
          this_00 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)&stack0xffffffffffffffc0,(long)local_14c);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_17c)
          ;
          *pvVar8 = dVar9 + local_188;
        }
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                  ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                   (in_RDI + 0xf0),(long)iVar2);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                  ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                   &stack0xffffffffffffff78,(long)local_14c);
        SymmetricMatrix::operator=((SymmetricMatrix *)in_stack_fffffffffffffdc0._M_current,matrix);
      }
      else {
        dVar9 = *(double *)(in_RDI + 0x38);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](in_RSI,(long)local_14c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
        if ((dVar9 != *pvVar5) || (NAN(dVar9) || NAN(*pvVar5))) goto LAB_0010ca67;
      }
    }
    bVar1 = false;
LAB_0010cdbc:
    GaussianMixtureModeling::Buffer::~Buffer(in_stack_fffffffffffffdb0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0._M_current);
    if (!bVar1) {
      bVar1 = NonrecursiveMaximumLikelihoodParameterGeneration::Run
                        (in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,in_stack_000003b0);
      if (bVar1) {
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
              ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
               in_stack_fffffffffffffdc0._M_current);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffffdc0._M_current);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool GaussianMixtureModelBasedConversion::Run(
    const std::vector<std::vector<double> >& source_vectors,
    std::vector<std::vector<double> >* target_vectors) const {
  // Check inputs.
  if (!is_valid_ || source_vectors.empty() || NULL == target_vectors) {
    return false;
  }

  // Prepare memories.
  const int sequence_length(static_cast<int>(source_vectors.size()));
  std::vector<std::vector<double> > e(
      sequence_length, std::vector<double>(target_length_, magic_number_));
  std::vector<SymmetricMatrix> d(sequence_length,
                                 SymmetricMatrix(target_length_));

  // Compute posterior probabilities of source input.
  {
    std::vector<double> components_of_log_probability(num_mixture_);
    GaussianMixtureModeling::Buffer buffer;
    for (int t(0); t < sequence_length; ++t) {
      if (use_magic_number_ && magic_number_ == source_vectors[t][0]) {
        continue;
      }

      if (!GaussianMixtureModeling::CalculateLogProbability(
              source_length_ - 1, num_mixture_, false, 0 == t,
              source_vectors[t], weights_, source_mean_vectors_,
              source_covariance_matrices_, &components_of_log_probability, NULL,
              &buffer)) {
        return false;
      }

      const int selected_mixture(static_cast<int>(
          std::max_element(components_of_log_probability.begin(),
                           components_of_log_probability.end()) -
          components_of_log_probability.begin()));

      // Set E.
      for (int l(0); l < target_length_; ++l) {
        double tmp(0.0);
        for (int m(0); m < source_length_; ++m) {
          tmp += e_slope_[selected_mixture][l][m] * source_vectors[t][m];
        }
        e[t][l] = e_bias_[selected_mixture][l] + tmp;
      }

      // Set D.
      d[t] = d_[selected_mixture];
    }
  }

  if (!mlpg_.Run(e, d, target_vectors)) {
    return false;
  }

  return true;
}